

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>> *this,
          FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_> *field,ParsingContext *context,
          TagSet<Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<140U,_Fixpp::Type::Float>,_Fixpp::TagT<303U,_Fixpp::Type::Int>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<38U,_Fixpp::Type::Float>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<40U,_Fixpp::Type::Char>,_Fixpp::TagT<193U,_Fixpp::Type::String>,_Fixpp::TagT<192U,_Fixpp::Type::Float>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<15U,_Fixpp::Type::String>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  StreamBuf<char> *pSVar8;
  
  this_00 = context->cursor;
  pSVar8 = this_00->buf;
  lVar1 = *(long *)&pSVar8->field_0x8;
  pcVar2 = *(char **)&pSVar8->field_0x10;
  pcVar5 = pcVar2;
  while( true ) {
    pcVar7 = *(char **)&pSVar8->field_0x18;
    if (pcVar7 == pcVar5) {
      lVar6 = (**(code **)(*(long *)pSVar8 + 0x38))();
      if (lVar6 == 0) {
        ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x15f);
        return;
      }
      pSVar8 = this_00->buf;
      pcVar5 = *(char **)&pSVar8->field_0x10;
      pcVar7 = *(char **)&pSVar8->field_0x18;
    }
    if (pcVar5 < pcVar7) {
      cVar4 = *pcVar5;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar8 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar8 = this_00->buf;
    pcVar5 = *(char **)&pSVar8->field_0x10;
  }
  lVar6 = *(long *)&this_00->buf->field_0x10;
  lVar3 = *(long *)&this_00->buf->field_0x8;
  (field->m_view).first = pcVar2;
  (field->m_view).second = (lVar1 + lVar6) - (long)(pcVar2 + lVar3);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }